

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

int __thiscall Fl_Tree::deselect_all(Fl_Tree *this,Fl_Tree_Item *item,int docallback)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if ((item == (Fl_Tree_Item *)0x0) && (item = this->_root, item == (Fl_Tree_Item *)0x0)) {
    iVar1 = 0;
  }
  else {
    if (item->_selected == '\0') {
      iVar1 = 0;
    }
    else {
      iVar1 = deselect(this,item,docallback);
    }
    if (0 < (item->_children)._total) {
      lVar3 = 0;
      do {
        iVar2 = deselect_all(this,(item->_children)._items[lVar3],docallback);
        iVar1 = iVar1 + iVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (item->_children)._total);
    }
  }
  return iVar1;
}

Assistant:

int Fl_Tree::deselect_all(Fl_Tree_Item *item, int docallback) {
  item = item ? item : first();			// NULL? use first()
  if ( ! item ) return(0);
  int count = 0;
  // Deselect item
  if ( item->is_selected() )
    if ( deselect(item, docallback) )
      ++count;
  // Deselect its children
  for ( int t=0; t<item->children(); t++ ) {
    count += deselect_all(item->child(t), docallback);	// recurse
  }
  return(count);
}